

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop.cpp
# Opt level: O2

int ncnn::binary_op_no_broadcast<ncnn::binary_op_pow>(Mat *a,Mat *b,Mat *c,Option *opt)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  ulong extraout_RAX;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  int i;
  ulong uVar12;
  void *pvVar13;
  void *pvVar14;
  void *pvVar15;
  float fVar16;
  
  uVar9 = a->h * a->w * a->d;
  pvVar15 = a->data;
  sVar1 = a->cstep;
  pvVar13 = b->data;
  sVar2 = b->cstep;
  sVar3 = c->cstep;
  sVar4 = c->elemsize;
  uVar11 = 0;
  uVar10 = (ulong)uVar9;
  if ((int)uVar9 < 1) {
    uVar10 = uVar11;
  }
  pvVar14 = c->data;
  uVar7 = (ulong)(uint)a->c;
  if (a->c < 1) {
    uVar7 = uVar11;
  }
  sVar5 = b->elemsize;
  sVar6 = a->elemsize;
  uVar8 = uVar7;
  for (; uVar11 != uVar7; uVar11 = uVar11 + 1) {
    for (uVar12 = 0; uVar10 != uVar12; uVar12 = uVar12 + 1) {
      fVar16 = powf(*(float *)((long)pvVar15 + uVar12 * 4),*(float *)((long)pvVar13 + uVar12 * 4));
      *(float *)((long)pvVar14 + uVar12 * 4) = fVar16;
      uVar8 = extraout_RAX;
    }
    pvVar14 = (void *)((long)pvVar14 + sVar3 * sVar4);
    pvVar13 = (void *)((long)pvVar13 + sVar2 * sVar5);
    pvVar15 = (void *)((long)pvVar15 + sVar1 * sVar6);
  }
  return (int)uVar8;
}

Assistant:

static int binary_op_no_broadcast(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int channels = a.c;
    int size = a.w * a.h * a.d;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float* ptr1 = b.channel(q);
        float* outptr = c.channel(q);

        for (int i = 0; i < size; i++)
        {
            outptr[i] = op(ptr[i], ptr1[i]);
        }
    }

    return 0;
}